

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int attlist1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok < 0x12) {
    iVar1 = 0x21;
    if (tok == 0xf) {
      return 0x21;
    }
    if (tok == 0x11) {
      pcVar2 = internalSubset;
      goto LAB_005ee4b1;
    }
  }
  else if ((tok == 0x29) || (tok == 0x12)) {
    iVar1 = 0x16;
    pcVar2 = attlist2;
    goto LAB_005ee4b1;
  }
  iVar1 = -1;
  pcVar2 = error;
LAB_005ee4b1:
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static int PTRCALL
attlist1(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = attlist2;
    return XML_ROLE_ATTRIBUTE_NAME;
  }
  return common(state, tok);
}